

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

idx_t __thiscall
duckdb::DictionaryCompressionCompressState::Finalize(DictionaryCompressionCompressState *this)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  CompressionInfo *this_01;
  uint32_t *puVar1;
  uint uVar2;
  uint *src;
  uint uVar3;
  DatabaseInstance *db;
  BufferManager *pBVar4;
  pointer pCVar5;
  idx_t iVar6;
  data_ptr_t pdVar7;
  idx_t iVar8;
  type segment;
  ulong __n;
  size_t __n_00;
  long lVar9;
  BufferHandle handle;
  BufferHandle local_48;
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  pBVar4 = BufferManager::GetBufferManager(db);
  this_00 = &this->current_segment;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  (*pBVar4->_vptr_BufferManager[7])(&local_48,pBVar4,&pCVar5->block);
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  iVar6 = BitpackingPrimitives::GetRequiredSize
                    ((pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
                     super___atomic_base<unsigned_long>._M_i,this->current_width);
  __n_00 = (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar2 = (this->current_dictionary).size;
  pdVar7 = BufferHandle::Ptr(&local_48);
  src = (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  BitpackingPrimitives::PackBuffer<unsigned_int,false>
            (pdVar7 + 0x14,src,
             (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i,this->current_width);
  switchD_0193dc74::default
            (pdVar7 + iVar6 + 0x14,
             (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,__n_00);
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar6 + 0x14);
  *(uint *)(pdVar7 + 8) = uVar3;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    ((long)(this->index_buffer).
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->index_buffer).
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  *(uint *)(pdVar7 + 0xc) = uVar3;
  *(uint *)(pdVar7 + 0x10) = (uint)this->current_width;
  this_01 = &(this->super_DictionaryCompressionState).super_CompressionState.info;
  iVar8 = CompressionInfo::GetCompactionFlushLimit(this_01);
  lVar9 = iVar6 + __n_00 + 0x14;
  iVar6 = (ulong)uVar2 + lVar9;
  if (iVar6 < iVar8) {
    iVar8 = CompressionInfo::GetBlockSize(this_01);
    __n = (ulong)(this->current_dictionary).size;
    memmove(pdVar7 + lVar9,pdVar7 + ((this->current_dictionary).end - __n),__n);
    puVar1 = &(this->current_dictionary).end;
    *puVar1 = *puVar1 + ((int)iVar6 - (int)iVar8);
    segment = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator*(this_00);
    DictionaryCompression::SetDictionary(segment,&local_48,this->current_dictionary);
  }
  else {
    iVar6 = CompressionInfo::GetBlockSize(this_01);
  }
  BufferHandle::~BufferHandle(&local_48);
  return iVar6;
}

Assistant:

idx_t DictionaryCompressionCompressState::Finalize() {
	auto &buffer_manager = BufferManager::GetBufferManager(checkpoint_data.GetDatabase());
	auto handle = buffer_manager.Pin(current_segment->block);
	D_ASSERT(current_dictionary.end == info.GetBlockSize());

	// calculate sizes
	auto compressed_selection_buffer_size =
	    BitpackingPrimitives::GetRequiredSize(current_segment->count, current_width);
	auto index_buffer_size = index_buffer.size() * sizeof(uint32_t);
	auto total_size = DictionaryCompression::DICTIONARY_HEADER_SIZE + compressed_selection_buffer_size +
	                  index_buffer_size + current_dictionary.size;

	// calculate ptr and offsets
	auto base_ptr = handle.Ptr();
	auto header_ptr = reinterpret_cast<dictionary_compression_header_t *>(base_ptr);
	auto compressed_selection_buffer_offset = DictionaryCompression::DICTIONARY_HEADER_SIZE;
	auto index_buffer_offset = compressed_selection_buffer_offset + compressed_selection_buffer_size;

	// Write compressed selection buffer
	BitpackingPrimitives::PackBuffer<sel_t, false>(base_ptr + compressed_selection_buffer_offset,
	                                               (sel_t *)(selection_buffer.data()), current_segment->count,
	                                               current_width);

	// Write the index buffer
	memcpy(base_ptr + index_buffer_offset, index_buffer.data(), index_buffer_size);

	// Store sizes and offsets in segment header
	Store<uint32_t>(NumericCast<uint32_t>(index_buffer_offset), data_ptr_cast(&header_ptr->index_buffer_offset));
	Store<uint32_t>(NumericCast<uint32_t>(index_buffer.size()), data_ptr_cast(&header_ptr->index_buffer_count));
	Store<uint32_t>((uint32_t)current_width, data_ptr_cast(&header_ptr->bitpacking_width));

	D_ASSERT(current_width == BitpackingPrimitives::MinimumBitWidth(index_buffer.size() - 1));
	D_ASSERT(DictionaryCompression::HasEnoughSpace(current_segment->count, index_buffer.size(), current_dictionary.size,
	                                               current_width, info.GetBlockSize()));
	D_ASSERT((uint64_t)*max_element(std::begin(selection_buffer), std::end(selection_buffer)) ==
	         index_buffer.size() - 1);

	// Early-out, if the block is sufficiently full.
	if (total_size >= info.GetCompactionFlushLimit()) {
		return info.GetBlockSize();
	}

	// Sufficient space: calculate how much space we can save.
	auto move_amount = info.GetBlockSize() - total_size;

	// Move the dictionary to align it with the offsets.
	auto new_dictionary_offset = index_buffer_offset + index_buffer_size;
	memmove(base_ptr + new_dictionary_offset, base_ptr + current_dictionary.end - current_dictionary.size,
	        current_dictionary.size);
	current_dictionary.end -= move_amount;
	D_ASSERT(current_dictionary.end == total_size);

	// Write the new dictionary with the updated "end".
	DictionaryCompression::SetDictionary(*current_segment, handle, current_dictionary);
	return total_size;
}